

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

String * __thiscall
kj::PathPtr::toString(String *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  long lVar1;
  String *pSVar2;
  void *pvVar3;
  char *__dest;
  size_t sVar4;
  undefined7 in_register_00000011;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  void *__src;
  kj *this_00;
  long lVar9;
  ArrayPtr<const_kj::String> *__range1;
  Fault f;
  DebugComparison<char_*&,_char_*> _kjCondition;
  Fault local_70;
  char *local_68;
  String *local_60;
  DebugComparison<char_*&,_char_*> local_58;
  
  uVar7 = CONCAT71(in_register_00000011,absolute) & 0xffffffff;
  sVar6 = (this->parts).size_;
  if (sVar6 == 0) {
    if ((byte)uVar7 == 0) {
      this_00 = (kj *)0x20205a;
    }
    else {
      this_00 = (kj *)0x20d69d;
    }
    str<char_const(&)[2]>
              (__return_storage_ptr__,this_00,(char (*) [2])CONCAT71(in_register_00000011,absolute))
    ;
  }
  else {
    sVar8 = sVar6 - (byte)((byte)uVar7 ^ 1);
    lVar5 = 0;
    do {
      lVar1 = *(long *)((long)&(((this->parts).ptr)->content).size_ + lVar5);
      lVar9 = 0;
      if (lVar1 != 0) {
        lVar9 = lVar1 + -1;
      }
      sVar8 = sVar8 + lVar9;
      lVar5 = lVar5 + 0x18;
    } while (sVar6 * 0x18 != lVar5);
    heapString(__return_storage_ptr__,sVar8);
    local_58.right = (__return_storage_ptr__->content).ptr;
    sVar6 = (__return_storage_ptr__->content).size_;
    local_68 = local_58.right;
    if (sVar6 == 0) {
      local_68 = (char *)0x0;
    }
    sVar8 = (this->parts).size_;
    if (sVar8 != 0) {
      pSVar2 = (this->parts).ptr;
      lVar5 = 0;
      local_60 = __return_storage_ptr__;
      do {
        __dest = local_68;
        if ((uVar7 & 1) != 0) {
          *local_68 = '/';
          __dest = local_68 + 1;
        }
        pvVar3 = *(void **)((long)&(pSVar2->content).size_ + lVar5);
        __src = pvVar3;
        if (pvVar3 != (void *)0x0) {
          __src = *(void **)((long)&(pSVar2->content).ptr + lVar5);
        }
        sVar4 = (long)pvVar3 - 1;
        if (pvVar3 == (void *)0x0) {
          sVar4 = 0;
        }
        memcpy(__dest,__src,sVar4);
        lVar1 = *(long *)((long)&(pSVar2->content).size_ + lVar5);
        sVar4 = lVar1 - 1;
        if (lVar1 == 0) {
          sVar4 = 0;
        }
        local_68 = __dest + sVar4;
        lVar5 = lVar5 + 0x18;
        uVar7 = 1;
      } while (sVar8 * 0x18 != lVar5);
      local_58.right = (local_60->content).ptr;
      sVar6 = (local_60->content).size_;
      __return_storage_ptr__ = local_60;
    }
    local_58.right = local_58.right + (sVar6 - 1);
    if (sVar6 == 0) {
      local_58.right = (char *)0x0;
    }
    local_58.left = &local_68;
    local_58.op.content.ptr = " == ";
    local_58.op.content.size_ = 5;
    local_58.result = local_68 == local_58.right;
    if (!local_58.result) {
      _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x9a,FAILED,"ptr == result.end()","_kjCondition,",&local_58);
      _::Debug::Fault::fatal(&local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}